

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * QByteArray::toUpper_helper(QByteArray *__return_storage_ptr__,QByteArray *a)

{
  toCase_template<QByteArray>(__return_storage_ptr__,a,asciiUpper);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::toUpper_helper(QByteArray &a)
{
    return toCase_template(a, asciiUpper);
}